

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

session_interface * __thiscall cppcms::http::context::session(context *this)

{
  pointer psVar1;
  _data *p_Var2;
  type psVar3;
  long in_RDI;
  context *in_stack_00000028;
  pointer in_stack_ffffffffffffffc8;
  unique_ptr<cppcms::session_interface,_std::default_delete<cppcms::session_interface>_>
  *in_stack_ffffffffffffffd0;
  
  booster::hold_ptr<cppcms::http::context::_data>::operator->
            ((hold_ptr<cppcms::http::context::_data> *)(in_RDI + 0x10));
  psVar1 = std::
           unique_ptr<cppcms::session_interface,_std::default_delete<cppcms::session_interface>_>::
           get(in_stack_ffffffffffffffd0);
  if (psVar1 == (pointer)0x0) {
    p_Var2 = booster::hold_ptr<cppcms::http::context::_data>::operator->
                       ((hold_ptr<cppcms::http::context::_data> *)(in_RDI + 0x10));
    in_stack_ffffffffffffffd0 = &p_Var2->session;
    operator_new(0xc0);
    session_interface::session_interface((session_interface *)this,in_stack_00000028);
    std::unique_ptr<cppcms::session_interface,_std::default_delete<cppcms::session_interface>_>::
    reset(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  booster::hold_ptr<cppcms::http::context::_data>::operator->
            ((hold_ptr<cppcms::http::context::_data> *)(in_RDI + 0x10));
  psVar3 = std::
           unique_ptr<cppcms::session_interface,_std::default_delete<cppcms::session_interface>_>::
           operator*(in_stack_ffffffffffffffd0);
  return psVar3;
}

Assistant:

session_interface &context::session()
{
	if(!d->session.get())
		d->session.reset(new session_interface(*this));
	return *d->session;
}